

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O0

bool SQLite::Database::isUnencrypted(string *aFilename)

{
  long lVar1;
  byte bVar2;
  _Ios_Openmode _Var3;
  int iVar4;
  long lVar5;
  char *pcVar6;
  Exception *pEVar7;
  long in_FS_OFFSET;
  undefined1 local_298 [8];
  Exception exception;
  Exception exception_1;
  char local_258 [8];
  ifstream fileBuffer;
  string *aFilename_local;
  char local_28 [8];
  char header [16];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar5 = std::__cxx11::string::length();
  if (lVar5 == 0) {
    Exception::Exception
              ((Exception *)local_298,"Could not open database, the aFilename parameter was empty.")
    ;
    pEVar7 = (Exception *)__cxa_allocate_exception(0x18);
    Exception::Exception(pEVar7,(Exception *)local_298);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(pEVar7,&Exception::typeinfo,Exception::~Exception);
    }
  }
  else {
    pcVar6 = (char *)std::__cxx11::string::c_str();
    _Var3 = std::operator|(_S_in,_S_bin);
    std::ifstream::ifstream(local_258,pcVar6,_Var3);
    bVar2 = std::ifstream::is_open();
    if ((bVar2 & 1) == 0) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &aFilename_local,"Error opening file: ",aFilename);
      Exception::Exception((Exception *)&exception.mErrcode,(string *)&aFilename_local);
      std::__cxx11::string::~string((string *)&aFilename_local);
      pEVar7 = (Exception *)__cxa_allocate_exception(0x18);
      Exception::Exception(pEVar7,(Exception *)&exception.mErrcode);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        __cxa_throw(pEVar7,&Exception::typeinfo,Exception::~Exception);
      }
    }
    else {
      std::istream::seekg((long)local_258,_S_beg);
      std::istream::getline(local_258,(long)local_28);
      std::ifstream::close();
      iVar4 = strncmp(local_28,"SQLite format 3",0x10);
      std::ifstream::~ifstream(local_258);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return iVar4 == 0;
      }
    }
  }
  __stack_chk_fail();
}

Assistant:

bool Database::isUnencrypted(const std::string& aFilename)
{
    if (aFilename.length() > 0) {
        std::ifstream fileBuffer(aFilename.c_str(), std::ios::in | std::ios::binary);
        char header[16];
        if (fileBuffer.is_open()) {
            fileBuffer.seekg(0, std::ios::beg);
            fileBuffer.getline(header, 16);
            fileBuffer.close();
        } else {
            const SQLite::Exception exception("Error opening file: " + aFilename);
            throw exception;
        }
        return strncmp(header, "SQLite format 3\000", 16) == 0;
    }
    const SQLite::Exception exception("Could not open database, the aFilename parameter was empty.");
    throw exception;
}